

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void * handle_client(void *arg)

{
  bool bVar1;
  player_modes pVar2;
  int iVar3;
  ssize_t sVar4;
  ostream *poVar5;
  iterator __first;
  iterator __last;
  void *this;
  reference ppTVar6;
  byte local_505;
  undefined1 local_500 [80];
  undefined1 local_4b0 [32];
  undefined1 local_490 [80];
  undefined1 local_440 [32];
  undefined1 local_420 [80];
  undefined1 local_3d0 [80];
  Player local_380;
  Player local_350;
  undefined1 local_320 [40];
  undefined1 local_2f8 [4];
  StatusCode status;
  _Self local_2d8;
  iterator end;
  _Self local_290;
  _List_iterator<TTTGame_*> game;
  undefined1 local_258 [8];
  Player player;
  int i;
  int col;
  int row;
  char temp;
  bool client_connected;
  char buffer [512];
  int client_sock;
  void *arg_local;
  
  buffer._508_4_ = *arg;
  col._3_1_ = 1;
  col._2_1_ = '\0';
  i = 0;
  player._44_4_ = 0;
  player.m_mode = COMMAND;
  Player::Player((Player *)local_258,buffer._508_4_);
  while ((col._3_1_ & 1) != 0) {
    pVar2 = Player::GetMode((Player *)local_258);
    if (pVar2 == COMMAND) {
      player.m_mode = COMMAND;
      while( true ) {
        local_505 = 0;
        if (((int)player.m_mode < 0x1ff) && (local_505 = 0, col._2_1_ != '\n')) {
          local_505 = col._3_1_;
        }
        if ((local_505 & 1) == 0) break;
        sVar4 = read(buffer._508_4_,(void *)((long)&col + 2),1);
        if (sVar4 == 0) {
          col._3_1_ = 0;
        }
        else {
          *(char *)((long)&row + (long)(int)player.m_mode) = col._2_1_;
        }
        player.m_mode = player.m_mode + INGAME;
      }
      col._2_1_ = '\0';
      *(undefined1 *)((long)&row + (long)(int)player.m_mode) = 0;
      *(undefined1 *)((long)&row + (long)(int)(player.m_mode - INGAME)) = 0;
      poVar5 = std::operator<<((ostream *)&std::cout,"Received command \"");
      poVar5 = std::operator<<(poVar5,(char *)&row);
      poVar5 = std::operator<<(poVar5,"\" from ");
      Player::GetName_abi_cxx11_((Player *)&game);
      poVar5 = std::operator<<(poVar5,(string *)&game);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&game);
      *(undefined1 *)((long)&row + (long)(int)(player.m_mode - INGAME)) = 10;
      bVar1 = ProcessCommand((char *)&row,(Player *)local_258,(bool *)((long)&col + 3));
      if (!bVar1) {
        iVar3 = Player::GetSocket((Player *)local_258);
        SendStatus(iVar3,INVALID_CMD);
      }
    }
    else {
      pVar2 = Player::GetMode((Player *)local_258);
      if (pVar2 == INGAME) {
        pthread_mutex_lock((pthread_mutex_t *)&games_lock);
        __first = std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::begin
                            (&game_list_abi_cxx11_);
        __last = std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::end
                           (&game_list_abi_cxx11_);
        Player::Player((Player *)&end,(Player *)local_258);
        local_290._M_node =
             (_List_node_base *)
             std::find_if<std::_List_iterator<TTTGame*>,handle_client(void*)::__0>
                       (__first._M_node,__last._M_node,(anon_class_48_1_66628c1f_for__M_pred *)&end)
        ;
        handle_client(void*)::$_0::~__0((__0 *)&end);
        local_2d8._M_node =
             (_List_node_base *)
             std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::end(&game_list_abi_cxx11_);
        pthread_mutex_unlock((pthread_mutex_t *)&games_lock);
        bVar1 = std::operator==(&local_290,&local_2d8);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Somehow Player ");
          Player::GetName_abi_cxx11_((Player *)local_2f8);
          poVar5 = std::operator<<(poVar5,(string *)local_2f8);
          poVar5 = std::operator<<(poVar5," isn\'t a part of a game but is INGAME");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_2f8);
        }
        else {
          iVar3 = Player::GetSocket((Player *)local_258);
          col._3_1_ = ReceiveStatus(iVar3,(StatusCode *)(local_320 + 0x24));
          if ((bool)col._3_1_) {
            if (local_320._36_4_ == 9) {
              iVar3 = Player::GetSocket((Player *)local_258);
              ReceiveInt(iVar3,&i);
              iVar3 = Player::GetSocket((Player *)local_258);
              ReceiveInt(iVar3,(int *)&player.field_0x2c);
              poVar5 = std::operator<<((ostream *)&std::cout,"Received moved from ");
              Player::GetName_abi_cxx11_((Player *)local_320);
              poVar5 = std::operator<<(poVar5,(string *)local_320);
              poVar5 = std::operator<<(poVar5,": row=");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,i);
              poVar5 = std::operator<<(poVar5,", col=");
              this = (void *)std::ostream::operator<<(poVar5,player._44_4_);
              std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)local_320);
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer(&local_350,*ppTVar6,(Player *)local_258);
              iVar3 = Player::GetSocket(&local_350);
              SendStatus(iVar3,MOVE);
              Player::~Player(&local_350);
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer(&local_380,*ppTVar6,(Player *)local_258);
              iVar3 = Player::GetSocket(&local_380);
              SendInt(iVar3,i);
              Player::~Player(&local_380);
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer((Player *)(local_3d0 + 0x20),*ppTVar6,(Player *)local_258);
              iVar3 = Player::GetSocket((Player *)(local_3d0 + 0x20));
              col._3_1_ = SendInt(iVar3,player._44_4_);
              Player::~Player((Player *)(local_3d0 + 0x20));
              poVar5 = std::operator<<((ostream *)&std::cout,"Sent move to ");
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer((Player *)(local_420 + 0x20),*ppTVar6,(Player *)local_258);
              Player::GetName_abi_cxx11_((Player *)local_3d0);
              poVar5 = std::operator<<(poVar5,(string *)local_3d0);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)local_3d0);
              Player::~Player((Player *)(local_420 + 0x20));
            }
            else if (local_320._36_4_ == 10) {
              Player::GetName_abi_cxx11_((Player *)local_420);
              poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_420);
              poVar5 = std::operator<<(poVar5," won a game against ");
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer((Player *)(local_490 + 0x20),*ppTVar6,(Player *)local_258);
              Player::GetName_abi_cxx11_((Player *)local_440);
              poVar5 = std::operator<<(poVar5,(string *)local_440);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)local_440);
              Player::~Player((Player *)(local_490 + 0x20));
              std::__cxx11::string::~string((string *)local_420);
              col._3_1_ = 0;
            }
            else if (local_320._36_4_ == 0xb) {
              Player::GetName_abi_cxx11_((Player *)local_490);
              poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_490);
              poVar5 = std::operator<<(poVar5," tied against ");
              ppTVar6 = std::_List_iterator<TTTGame_*>::operator*(&local_290);
              TTTGame::GetOtherPlayer((Player *)(local_500 + 0x20),*ppTVar6,(Player *)local_258);
              Player::GetName_abi_cxx11_((Player *)local_4b0);
              poVar5 = std::operator<<(poVar5,(string *)local_4b0);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)local_4b0);
              Player::~Player((Player *)(local_500 + 0x20));
              std::__cxx11::string::~string((string *)local_490);
              col._3_1_ = 0;
            }
            else {
              iVar3 = Player::GetSocket((Player *)local_258);
              col._3_1_ = SendStatus(iVar3,INVALID_CMD);
            }
          }
        }
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Player \"");
  Player::GetName_abi_cxx11_((Player *)local_500);
  poVar5 = std::operator<<(poVar5,(string *)local_500);
  poVar5 = std::operator<<(poVar5,"\" has disconnected");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_500);
  DisconnectPlayer((Player *)local_258);
  close(buffer._508_4_);
  Player::~Player((Player *)local_258);
  return (void *)0x0;
}

Assistant:

void * handle_client(void * arg)
{
    int client_sock = *(int *)arg;
    char buffer[BUF_SIZE];
    bool client_connected = true;
    char temp = '\0';
    int row = 0, col = 0;
    int i = 0;

    // Create the player
    Player player(client_sock);

    // Always handle the client
    while(client_connected)
    {
        // Process commands or pass game data
        if(player.GetMode() == COMMAND)
        {
            // Read a line of text or until the buffer is full
            for(i = 0; (i < (BUF_SIZE - 1)) && temp != '\n' && client_connected; ++i)
            {
                // Receive a single character and make sure the client is still connected
                if(read(client_sock, &temp, 1) == 0)
                    client_connected = false;
                else
                    buffer[i] = temp;
            }

            // Reset temp so we don't get an infinite loop
            temp = '\0';
            buffer[i] = '\0';
            buffer[i - 1] = '\0';
            cout << "Received command \"" << buffer << "\" from " << player.GetName() << endl;
            buffer[i - 1] = '\n';

            // If there's an invalid command, tell the client
            if(!ProcessCommand(buffer, player, client_connected))
                SendStatus(player.GetSocket(), INVALID_CMD);
        }
        else if (player.GetMode() == INGAME)
        {
            // Get the game the player is a part of
            pthread_mutex_lock(&games_lock);
            auto game = find_if(game_list.begin(), game_list.end(),
                      [player] (TTTGame * game) { return game->HasPlayer(player); });
            auto end = game_list.end();
            pthread_mutex_unlock(&games_lock);

            // Something horrible has gone wrong
            if(game == end)
                cout << "Somehow Player " << player.GetName() << " isn't a part of a game but is INGAME" << endl;
            else
            {
                StatusCode status;
                client_connected = ReceiveStatus(player.GetSocket(), &status);

                // If the player is still connected, then perform the move
                if(client_connected)
                {
                    switch(status)
                    {
                        case MOVE:
                            // Pass the row and column right along
                            ReceiveInt(player.GetSocket(), &row);
                            ReceiveInt(player.GetSocket(), &col);
                            cout << "Received moved from " << player.GetName()
                                 << ": row=" << row << ", col=" << col << endl;

                            SendStatus((*game)->GetOtherPlayer(player).GetSocket(), MOVE);
                            SendInt((*game)->GetOtherPlayer(player).GetSocket(), row);
                            client_connected = SendInt((*game)->GetOtherPlayer(player).GetSocket(), col);
                            cout << "Sent move to " << (*game)->GetOtherPlayer(player).GetName() << endl;

                            break;
                        case WIN:
                            cout << player.GetName() << " won a game against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        case DRAW:
                            cout << player.GetName() << " tied against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        default:
                            client_connected = SendStatus(player.GetSocket(), INVALID_CMD);
                    }
                }
            }
        }
    }

    // The client disconnected on us D:
    cout << "Player \"" << player.GetName() << "\" has disconnected" << endl;
    DisconnectPlayer(player);
    close(client_sock);

    return (void *)0;
}